

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O3

void handle_resize(void)

{
  WINDOW *pWVar1;
  int iVar2;
  gamewin *pgVar3;
  
  for (pgVar3 = firstgw; pgVar3 != (gamewin *)0x0; pgVar3 = pgVar3->next) {
    if (pgVar3->resize != (_func_void_gamewin_ptr *)0x0) {
      (*pgVar3->resize)(pgVar3);
      pWVar1 = pgVar3->win;
      if (pWVar1 == (WINDOW *)0x0) {
        iVar2 = -1;
      }
      else {
        iVar2 = pWVar1->_maxy + 1;
      }
      wredrawln(pWVar1,0,iVar2);
      wnoutrefresh(pgVar3->win);
    }
  }
  rebuild_ui();
  doupdate();
  return;
}

Assistant:

void handle_resize(void)
{
    struct gamewin *gw;

    for (gw = firstgw; gw; gw = gw->next) {
	if (!gw->resize)
	    continue;

	gw->resize(gw);
	redrawwin(gw->win);
	wnoutrefresh(gw->win);
    }

    rebuild_ui();
    doupdate();
}